

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

SimplePathSuffixSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::SimplePathSuffixSyntax,slang::syntax::SeparatedSyntaxList<slang::syntax::NameSyntax>const&>
          (BumpAllocator *this,SeparatedSyntaxList<slang::syntax::NameSyntax> *args)

{
  SimplePathSuffixSyntax *this_00;
  
  this_00 = (SimplePathSuffixSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((SimplePathSuffixSyntax *)this->endPtr < this_00 + 1) {
    this_00 = (SimplePathSuffixSyntax *)allocateSlow(this,0x50,8);
  }
  else {
    this->head->current = (byte *)(this_00 + 1);
  }
  slang::syntax::SimplePathSuffixSyntax::SimplePathSuffixSyntax(this_00,args);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }